

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

Ivy_Obj_t * Ivy_GraphToNetworkSeq(Ivy_Man_t *p,Dec_Graph_t *pGraph)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Dec_Node_t *pDVar3;
  int local_40;
  int local_3c;
  int k;
  int i;
  Dec_Node_t *pNode;
  Ivy_Obj_t *pAnd1;
  Ivy_Obj_t *pAnd0;
  Dec_Graph_t *pGraph_local;
  Ivy_Man_t *p_local;
  
  _k = (Dec_Node_t *)0x0;
  iVar1 = Dec_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        _k = Dec_GraphNode(pGraph,local_3c);
        pDVar3 = Dec_GraphNode(pGraph,(uint)_k->eEdge0 >> 1 & 0x3fffffff);
        pAnd1 = Ivy_NotCond((Ivy_Obj_t *)(pDVar3->field_2).pFunc,(uint)_k->eEdge0 & 1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)_k->eEdge1 >> 1 & 0x3fffffff);
        pNode = (Dec_Node_t *)Ivy_NotCond((Ivy_Obj_t *)(pDVar3->field_2).pFunc,(uint)_k->eEdge1 & 1)
        ;
        for (local_40 = 0; local_40 < (int)(*(uint *)&_k->field_0x10 >> 0x11 & 0x1f);
            local_40 = local_40 + 1) {
          pAnd1 = Ivy_Latch(p,pAnd1,IVY_INIT_DC);
        }
        for (local_40 = 0; local_40 < (int)(*(uint *)&_k->field_0x10 >> 0x16 & 0x1f);
            local_40 = local_40 + 1) {
          pNode = (Dec_Node_t *)Ivy_Latch(p,(Ivy_Obj_t *)pNode,IVY_INIT_DC);
        }
        pIVar2 = Ivy_And(p,pAnd1,(Ivy_Obj_t *)pNode);
        (_k->field_2).pFunc = pIVar2;
      }
      for (local_40 = 0; local_40 < (int)(*(uint *)&_k->field_0x10 >> 0x1b); local_40 = local_40 + 1
          ) {
        pIVar2 = Ivy_Latch(p,(Ivy_Obj_t *)(_k->field_2).pFunc,IVY_INIT_DC);
        (_k->field_2).pFunc = pIVar2;
      }
      pIVar2 = (Ivy_Obj_t *)(_k->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
    }
    else {
      pDVar3 = Dec_GraphVar(pGraph);
      for (local_40 = 0; local_40 < (int)(*(uint *)&pDVar3->field_0x10 >> 0x1b);
          local_40 = local_40 + 1) {
        pIVar2 = Ivy_Latch(p,(Ivy_Obj_t *)(pDVar3->field_2).pFunc,IVY_INIT_DC);
        (pDVar3->field_2).pFunc = pIVar2;
      }
      pIVar2 = (Ivy_Obj_t *)(pDVar3->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
    }
  }
  else {
    pIVar2 = Ivy_ManConst1(p);
    iVar1 = Dec_GraphIsComplement(pGraph);
    p_local = (Ivy_Man_t *)Ivy_NotCond(pIVar2,iVar1);
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_GraphToNetworkSeq( Ivy_Man_t * p, Dec_Graph_t * pGraph )
{
    Ivy_Obj_t * pAnd0, * pAnd1;
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i, k;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Ivy_NotCond( Ivy_ManConst1(p), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
    {
        // get the variable node
        pNode = Dec_GraphVar(pGraph);
        // add the remaining latches
        for ( k = 0; k < (int)pNode->nLat2; k++ )
            pNode->pFunc = Ivy_Latch( p, (Ivy_Obj_t *)pNode->pFunc, IVY_INIT_DC );
        return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
    }
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Ivy_NotCond( (Ivy_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        // add the latches
        for ( k = 0; k < (int)pNode->nLat0; k++ )
            pAnd0 = Ivy_Latch( p, pAnd0, IVY_INIT_DC );
        for ( k = 0; k < (int)pNode->nLat1; k++ )
            pAnd1 = Ivy_Latch( p, pAnd1, IVY_INIT_DC );
        // create the node
        pNode->pFunc = Ivy_And( p, pAnd0, pAnd1 );
    }
    // add the remaining latches
    for ( k = 0; k < (int)pNode->nLat2; k++ )
        pNode->pFunc = Ivy_Latch( p, (Ivy_Obj_t *)pNode->pFunc, IVY_INIT_DC );
    // complement the result if necessary
    return Ivy_NotCond( (Ivy_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}